

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O3

void os_banner_size_to_contents(void *banner_handle)

{
  size_t sVar1;
  
  if (*(uint *)((long)banner_handle + 0x20) < 2) {
    sVar1 = oss_get_content_height((osgen_win_t *)banner_handle);
    if (*(size_t *)((long)banner_handle + 0x40) == sVar1) {
      return;
    }
  }
  else {
    sVar1 = oss_get_content_width((osgen_win_t *)banner_handle);
    if (*(size_t *)((long)banner_handle + 0x38) == sVar1) {
      return;
    }
  }
  *(int *)((long)banner_handle + 0x28) = (int)sVar1;
  *(undefined4 *)((long)banner_handle + 0x24) = 2;
  osgen_recalc_layout();
  return;
}

Assistant:

void os_banner_size_to_contents(void *banner_handle)
{
    osgen_win_t *win = (osgen_win_t *)banner_handle;

    /* the sizing depends on the window's alignment */
    if (win->alignment == OS_BANNER_ALIGN_TOP
        || win->alignment == OS_BANNER_ALIGN_BOTTOM)
    {
        size_t newy;

        /* calculate the new height */
        newy = oss_get_content_height(win);

        /* 
         *   if this is the same as the current height, there's no need to
         *   redraw anything 
         */
        if (win->ht == newy)
            return;

        /* set the new size as a fixed character-cell size */
        win->size = newy;
        win->size_type = OS_BANNER_SIZE_ABS;
    }
    else
    {
        size_t newx;

        /* calculate the new width */
        newx = oss_get_content_width(win);

        /* if the size isn't changing, there's no need to redraw */
        if (win->wid == newx)
            return;

        /* set the new size as a fixed character-cell size */
        win->size = newx;
        win->size_type = OS_BANNER_SIZE_ABS;
    }

    /* recalculate the window layout */
    osgen_recalc_layout();
}